

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

auto_ptr<cmFileListGeneratorBase> __thiscall
cmFileListGeneratorMacProject::Clone(cmFileListGeneratorMacProject *this)

{
  cmFileListGeneratorMacProject *this_00;
  cmFileListGeneratorMacProject *in_RSI;
  cmFileListGeneratorMacProject *this_local;
  auto_ptr<cmFileListGeneratorBase> *g;
  
  this_00 = (cmFileListGeneratorMacProject *)operator_new(0x38);
  cmFileListGeneratorMacProject(this_00,in_RSI);
  cmsys::auto_ptr<cmFileListGeneratorBase>::auto_ptr
            ((auto_ptr<cmFileListGeneratorBase> *)this,(cmFileListGeneratorBase *)this_00);
  return (auto_ptr<cmFileListGeneratorBase>)&this->super_cmFileListGeneratorBase;
}

Assistant:

virtual cmsys::auto_ptr<cmFileListGeneratorBase> Clone() const
    {
    cmsys::auto_ptr<cmFileListGeneratorBase>
      g(new cmFileListGeneratorMacProject(*this));
    return g;
    }